

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
::clear(heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
        *this)

{
  uintptr_t *puVar1;
  bool bVar2;
  ControlBlock *pCVar3;
  consume_operation consume;
  consume_operation local_20;
  
  local_20.m_control = (ControlBlock *)0x0;
  bVar2 = consume_operation::start_consume_impl(&local_20,0,this);
  if (bVar2) {
    do {
      consume_operation::commit(&local_20);
      bVar2 = consume_operation::start_consume_impl(&local_20,0,this);
    } while (bVar2);
  }
  pCVar3 = this->m_head;
  do {
    if (pCVar3 == this->m_tail) goto LAB_00a7bf9a;
    puVar1 = &pCVar3->m_next;
    pCVar3 = (ControlBlock *)(*puVar1 & 0xfffffffffffffff8);
  } while ((*puVar1 & 3) != 0);
  density_tests::detail::assert_failed<>
            ("empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
             ,0x1e8);
LAB_00a7bf9a:
  clean_dead_elements(this);
  if (local_20.m_control != (ControlBlock *)0x0) {
    cancel_consume_impl(local_20.m_queue,local_20.m_control);
  }
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }

            DENSITY_ASSERT_INTERNAL(empty());

            clean_dead_elements();
        }